

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

void __thiscall
HighsLp::deleteRowsFromVectors
          (HighsLp *this,HighsInt *new_num_row,HighsIndexCollection *index_collection)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference this_00;
  HighsIndexCollection *in_RDX;
  int *in_RSI;
  HighsInt *in_RDI;
  HighsInt row;
  HighsInt k;
  bool have_names;
  HighsInt row_dim;
  HighsInt current_set_entry;
  HighsInt keep_to_row;
  HighsInt keep_from_row;
  HighsInt delete_to_row;
  HighsInt delete_from_row;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar6;
  HighsInt HVar7;
  undefined4 uVar8;
  int iVar9;
  int in_stack_ffffffffffffffd4;
  int iVar10;
  int local_28;
  int local_24;
  int local_20;
  int local_1c [3];
  int *local_10;
  
  local_10 = in_RSI;
  limits(in_RDX,local_1c,&local_20);
  *local_10 = in_RDI[1];
  if (local_1c[0] <= local_20) {
    iVar9 = -1;
    uVar8 = 0;
    HVar7 = in_RDI[1];
    *local_10 = 0;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x58));
    uVar6 = CONCAT13(0 < (int)sVar3,(int3)in_stack_ffffffffffffffc4);
    for (iVar2 = local_1c[0]; iVar2 <= local_20; iVar2 = iVar2 + 1) {
      updateOutInIndex((HighsIndexCollection *)CONCAT44(in_stack_ffffffffffffffd4,iVar9),
                       (HighsInt *)CONCAT44(uVar8,HVar7),(HighsInt *)CONCAT44(uVar6,iVar2),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_RDI,in_stack_ffffffffffffffa8);
      if (iVar2 == local_1c[0]) {
        *local_10 = local_24;
      }
      iVar10 = in_stack_ffffffffffffffd4;
      if (HVar7 + -1 <= local_28) break;
      for (; in_stack_ffffffffffffffd4 <= iVar9;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),
                            (long)in_stack_ffffffffffffffd4);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),
                            (long)*local_10);
        *pvVar4 = vVar1;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)in_stack_ffffffffffffffd4);
        in_stack_ffffffffffffffa8 = (HighsInt *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),
                            (long)*local_10);
        *pvVar4 = (value_type)in_stack_ffffffffffffffa8;
        if ((uVar6 & 0x1000000) != 0) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(in_RDI + 0x58),(long)in_stack_ffffffffffffffd4);
          this_00 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(in_RDI + 0x58),(long)*local_10);
          std::__cxx11::string::operator=((string *)this_00,(string *)pvVar5);
        }
        *local_10 = *local_10 + 1;
      }
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffd4;
      if (HVar7 + -1 <= iVar9) break;
      in_stack_ffffffffffffffd4 = iVar10;
    }
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar6,iVar2),
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar6,iVar2),
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((uVar6 & 0x1000000) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(uVar6,iVar2),
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
  }
  return;
}

Assistant:

void HighsLp::deleteRowsFromVectors(
    HighsInt& new_num_row, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_row in case none is removed due to from_k > to_k
  new_num_row = this->num_row_;
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  HighsInt row_dim = this->num_row_;
  new_num_row = 0;
  bool have_names = (HighsInt)this->row_names_.size() > 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                     keep_from_row, keep_to_row, current_set_entry);
    if (k == from_k) {
      // Account for the initial rows being kept
      new_num_row = delete_from_row;
    }
    if (delete_to_row >= row_dim - 1) break;
    assert(delete_to_row < row_dim);
    for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
      this->row_lower_[new_num_row] = this->row_lower_[row];
      this->row_upper_[new_num_row] = this->row_upper_[row];
      if (have_names) this->row_names_[new_num_row] = this->row_names_[row];
      new_num_row++;
    }
    if (keep_to_row >= row_dim - 1) break;
  }
  this->row_lower_.resize(new_num_row);
  this->row_upper_.resize(new_num_row);
  if (have_names) this->row_names_.resize(new_num_row);
}